

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void __thiscall AActor::Deactivate(AActor *this,AActor *activator)

{
  uint uVar1;
  FState *newstate;
  FName local_c;
  
  if ((((this->flags3).Value & 0x2000) != 0) &&
     (((0 < this->health || ((int)(this->flags).Value < 0)) &&
      (uVar1 = (this->flags2).Value, (uVar1 >> 0x1c & 1) == 0)))) {
    (this->flags2).Value = uVar1 | 0x10000000;
    local_c.Index = 0xac;
    newstate = FindState(this,&local_c);
    if (newstate == (FState *)0x0) {
      this->tics = -1;
    }
    else {
      SetState(this,newstate,false);
    }
  }
  return;
}

Assistant:

void AActor::Deactivate (AActor *activator)
{
	if ((flags3 & MF3_ISMONSTER) && (health > 0 || (flags & MF_ICECORPSE)))
	{
		if (!(flags2 & MF2_DORMANT))
		{
			flags2 |= MF2_DORMANT;
			FState *state = FindState(NAME_Inactive);
			if (state != NULL) 
			{
				SetState(state);
			}
			else
			{
				tics = -1;
			}
		}
	}
}